

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

void __thiscall
wasm::ModAsyncify<false,_true,_false>::visitBinary
          (ModAsyncify<false,_true,_false> *this,Binary *curr)

{
  Expression *pEVar1;
  Const *expression;
  Builder local_18;
  Builder builder;
  
  if ((((curr->op - EqInt32 < 2) && (pEVar1 = curr->right, pEVar1->_id == ConstId)) &&
      (curr->left->_id == GlobalGetId)) &&
     ((char *)curr->left[1].type.id == (this->asyncifyStateName).super_IString.str._M_str)) {
    if (*(long *)(pEVar1 + 2) != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    if (*(int *)(pEVar1 + 1) == 1) {
      local_18.wasm =
           (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
           .
           super_PostWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
           .
           super_Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
           .currModule;
      expression = Builder::makeConst<int>(&local_18,(uint)(curr->op == NeInt32));
      Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
      ::replaceCurrent((Walker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::ModAsyncify<false,_true,_false>,_wasm::Visitor<wasm::ModAsyncify<false,_true,_false>,_void>_>
                       ,(Expression *)expression);
    }
  }
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    // Check if this is a comparison of the asyncify state to a specific
    // constant, which we may know is impossible.
    bool flip = false;
    if (curr->op == NeInt32) {
      flip = true;
    } else if (curr->op != EqInt32) {
      return;
    }
    auto* c = curr->right->dynCast<Const>();
    if (!c) {
      return;
    }
    auto* get = curr->left->dynCast<GlobalGet>();
    if (!get || get->name != asyncifyStateName) {
      return;
    }
    // This is a comparison of the state to a constant, check if we know the
    // value.
    int32_t value;
    auto checkedValue = c->value.geti32();
    if ((checkedValue == int(State::Unwinding) && neverUnwind) ||
        (checkedValue == int(State::Rewinding) && neverRewind)) {
      // We know the state is checked against an impossible value.
      value = 0;
    } else if (checkedValue == int(State::Unwinding) && this->unwinding) {
      // We know we are in fact unwinding right now.
      value = 1;
      unsetUnwinding();
    } else {
      return;
    }
    if (flip) {
      value = 1 - value;
    }
    Builder builder(*this->getModule());
    this->replaceCurrent(builder.makeConst(int32_t(value)));
  }